

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.cc
# Opt level: O0

Matrix33d * gmath::inv(Matrix33d *a)

{
  double *pdVar1;
  SMatrix<double,_3,_3> *in_RSI;
  SMatrix<double,_3,_3> *in_RDI;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double d;
  Matrix33d *ret;
  SMatrix<double,_3,_3> *in_stack_fffffffffffffef0;
  
  dVar2 = det<double>(in_stack_fffffffffffffef0);
  dVar2 = 1.0 / dVar2;
  SMatrix<double,_3,_3>::SMatrix(in_RDI);
  dVar3 = SMatrix<double,_3,_3>::operator()(in_RSI,1,1);
  dVar4 = SMatrix<double,_3,_3>::operator()(in_RSI,2,2);
  dVar5 = SMatrix<double,_3,_3>::operator()(in_RSI,1,2);
  dVar6 = SMatrix<double,_3,_3>::operator()(in_RSI,2,1);
  pdVar1 = SMatrix<double,_3,_3>::operator()(in_RDI,0,0);
  *pdVar1 = dVar2 * (dVar3 * dVar4 + -(dVar5 * dVar6));
  dVar3 = SMatrix<double,_3,_3>::operator()(in_RSI,0,2);
  dVar4 = SMatrix<double,_3,_3>::operator()(in_RSI,2,1);
  dVar5 = SMatrix<double,_3,_3>::operator()(in_RSI,0,1);
  dVar6 = SMatrix<double,_3,_3>::operator()(in_RSI,2,2);
  pdVar1 = SMatrix<double,_3,_3>::operator()(in_RDI,0,1);
  *pdVar1 = dVar2 * (dVar3 * dVar4 + -(dVar5 * dVar6));
  dVar3 = SMatrix<double,_3,_3>::operator()(in_RSI,0,1);
  dVar4 = SMatrix<double,_3,_3>::operator()(in_RSI,1,2);
  dVar5 = SMatrix<double,_3,_3>::operator()(in_RSI,0,2);
  dVar6 = SMatrix<double,_3,_3>::operator()(in_RSI,1,1);
  pdVar1 = SMatrix<double,_3,_3>::operator()(in_RDI,0,2);
  *pdVar1 = dVar2 * (dVar3 * dVar4 + -(dVar5 * dVar6));
  dVar3 = SMatrix<double,_3,_3>::operator()(in_RSI,1,2);
  dVar4 = SMatrix<double,_3,_3>::operator()(in_RSI,2,0);
  dVar5 = SMatrix<double,_3,_3>::operator()(in_RSI,1,0);
  dVar6 = SMatrix<double,_3,_3>::operator()(in_RSI,2,2);
  pdVar1 = SMatrix<double,_3,_3>::operator()(in_RDI,1,0);
  *pdVar1 = dVar2 * (dVar3 * dVar4 + -(dVar5 * dVar6));
  dVar3 = SMatrix<double,_3,_3>::operator()(in_RSI,0,0);
  dVar4 = SMatrix<double,_3,_3>::operator()(in_RSI,2,2);
  dVar5 = SMatrix<double,_3,_3>::operator()(in_RSI,0,2);
  dVar6 = SMatrix<double,_3,_3>::operator()(in_RSI,2,0);
  pdVar1 = SMatrix<double,_3,_3>::operator()(in_RDI,1,1);
  *pdVar1 = dVar2 * (dVar3 * dVar4 + -(dVar5 * dVar6));
  dVar3 = SMatrix<double,_3,_3>::operator()(in_RSI,0,2);
  dVar4 = SMatrix<double,_3,_3>::operator()(in_RSI,1,0);
  dVar5 = SMatrix<double,_3,_3>::operator()(in_RSI,0,0);
  dVar6 = SMatrix<double,_3,_3>::operator()(in_RSI,1,2);
  pdVar1 = SMatrix<double,_3,_3>::operator()(in_RDI,1,2);
  *pdVar1 = dVar2 * (dVar3 * dVar4 + -(dVar5 * dVar6));
  dVar3 = SMatrix<double,_3,_3>::operator()(in_RSI,1,0);
  dVar4 = SMatrix<double,_3,_3>::operator()(in_RSI,2,1);
  dVar5 = SMatrix<double,_3,_3>::operator()(in_RSI,1,1);
  dVar6 = SMatrix<double,_3,_3>::operator()(in_RSI,2,0);
  pdVar1 = SMatrix<double,_3,_3>::operator()(in_RDI,2,0);
  *pdVar1 = dVar2 * (dVar3 * dVar4 + -(dVar5 * dVar6));
  dVar3 = SMatrix<double,_3,_3>::operator()(in_RSI,0,1);
  dVar4 = SMatrix<double,_3,_3>::operator()(in_RSI,2,0);
  dVar5 = SMatrix<double,_3,_3>::operator()(in_RSI,0,0);
  dVar6 = SMatrix<double,_3,_3>::operator()(in_RSI,2,1);
  pdVar1 = SMatrix<double,_3,_3>::operator()(in_RDI,2,1);
  *pdVar1 = dVar2 * (dVar3 * dVar4 + -(dVar5 * dVar6));
  dVar3 = SMatrix<double,_3,_3>::operator()(in_RSI,0,0);
  dVar4 = SMatrix<double,_3,_3>::operator()(in_RSI,1,1);
  dVar5 = SMatrix<double,_3,_3>::operator()(in_RSI,0,1);
  dVar6 = SMatrix<double,_3,_3>::operator()(in_RSI,1,0);
  pdVar1 = SMatrix<double,_3,_3>::operator()(in_RDI,2,2);
  *pdVar1 = dVar2 * (dVar3 * dVar4 + -(dVar5 * dVar6));
  return in_RDI;
}

Assistant:

Matrix33d inv(const Matrix33d &a)
{
  double d=det(a);

  assert(d != 0);

  d=1.0/d;

  Matrix33d ret;

  ret(0, 0)=d*(a(1, 1)*a(2, 2)-a(1, 2)*a(2, 1));
  ret(0, 1)=d*(a(0, 2)*a(2, 1)-a(0, 1)*a(2, 2));
  ret(0, 2)=d*(a(0, 1)*a(1, 2)-a(0, 2)*a(1, 1));

  ret(1, 0)=d*(a(1, 2)*a(2, 0)-a(1, 0)*a(2, 2));
  ret(1, 1)=d*(a(0, 0)*a(2, 2)-a(0, 2)*a(2, 0));
  ret(1, 2)=d*(a(0, 2)*a(1, 0)-a(0, 0)*a(1, 2));

  ret(2, 0)=d*(a(1, 0)*a(2, 1)-a(1, 1)*a(2, 0));
  ret(2, 1)=d*(a(0, 1)*a(2, 0)-a(0, 0)*a(2, 1));
  ret(2, 2)=d*(a(0, 0)*a(1, 1)-a(0, 1)*a(1, 0));

  return ret;
}